

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndexedTest.cpp
# Opt level: O1

void __thiscall
vkt::Draw::anon_unknown_10::DrawIndexed::DrawIndexed
          (DrawIndexed *this,Context *context,TestSpec *testSpec)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_> *this_01;
  VkPrimitiveTopology VVar1;
  char *vertexShaderName;
  DrawIndexed *this_02;
  mapped_type *ppcVar2;
  iterator iVar3;
  int iVar4;
  key_type local_108;
  VertexElementData local_104;
  DrawIndexed *local_e0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_d8;
  RGBA local_d0 [2];
  float afStack_c8 [2];
  RGBA local_c0 [2];
  float afStack_b8 [2];
  RGBA local_b0 [2];
  float afStack_a8 [2];
  RGBA local_a0 [2];
  float afStack_98 [2];
  RGBA local_90 [2];
  float afStack_88 [2];
  RGBA local_80 [2];
  float afStack_78 [2];
  RGBA local_70 [2];
  float afStack_68 [2];
  RGBA local_60 [2];
  float afStack_58 [2];
  RGBA local_50 [2];
  float afStack_48 [2];
  RGBA local_40 [2];
  float afStack_38 [2];
  
  local_104.super_PositionColorVertex.position.m_data._0_8_ =
       local_104.super_PositionColorVertex.position.m_data._0_8_ & 0xffffffff00000000;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&testSpec->shaders,(key_type *)&local_104);
  vertexShaderName = *ppcVar2;
  local_108 = SHADERTYPE_FRAGMENT;
  ppcVar2 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[](&testSpec->shaders,&local_108);
  DrawTestsBaseClass::DrawTestsBaseClass
            (&this->super_DrawTestsBaseClass,context,vertexShaderName,*ppcVar2,testSpec->topology);
  (this->super_DrawTestsBaseClass).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__DrawIndexed_00d606c0;
  this_00 = &this->m_indexes;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_indexBuffer).m_ptr = (Buffer *)0x0;
  (this->m_indexBuffer).m_state = (SharedPtrStateBase *)0x0;
  VVar1 = (this->super_DrawTestsBaseClass).m_topology;
  local_e0 = this;
  local_d8 = this_00;
  if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
    local_104.super_PositionColorVertex.position.m_data._0_8_ =
         (ulong)(uint)local_104.super_PositionColorVertex.position.m_data[1] << 0x20;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 0;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data._0_8_ =
         local_104.super_PositionColorVertex.position.m_data._0_8_ & 0xffffffff00000000;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 0;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 2.8026e-45;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 2;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 0.0;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 0;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 6;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 7.00649e-45;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 5;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 0.0;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 0;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 9.80909e-45;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
      goto LAB_0070519f;
    }
  }
  else {
    if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) goto LAB_0070519f;
    local_104.super_PositionColorVertex.position.m_data._0_8_ =
         (ulong)(uint)local_104.super_PositionColorVertex.position.m_data[1] << 0x20;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 0;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data._0_8_ =
         local_104.super_PositionColorVertex.position.m_data._0_8_ & 0xffffffff00000000;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 0;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 2.8026e-45;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 2;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 0.0;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 0;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 6;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 8.40779e-45;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 6;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 0.0;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
    }
    else {
      *iVar3._M_current = 0;
      (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar3._M_current + 1;
    }
    local_104.super_PositionColorVertex.position.m_data[0] = 9.80909e-45;
    iVar3._M_current =
         (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (this_00,iVar3,(uint *)&local_104);
      goto LAB_0070519f;
    }
  }
  *iVar3._M_current = 7;
  (this->m_indexes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = iVar3._M_current + 1;
LAB_0070519f:
  this_01 = &(this->super_DrawTestsBaseClass).m_data;
  iVar4 = 0xd;
  do {
    local_108 = 0xffff0000;
    tcu::RGBA::toVec(local_40);
    local_104.super_PositionColorVertex.color.m_data[0] = (float)local_40[0].m_value;
    local_104.super_PositionColorVertex.color.m_data[1] = (float)local_40[1].m_value;
    local_104.super_PositionColorVertex.color.m_data[2] = afStack_38[0];
    local_104.super_PositionColorVertex.color.m_data[3] = afStack_38[1];
    local_104.super_PositionColorVertex.position.m_data[0] = -1.0;
    local_104.super_PositionColorVertex.position.m_data[1] = 1.0;
    local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
    local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
    local_104.refVertexIndex = 0xffffffff;
    std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
    emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_50);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_50[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_50[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_48[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_48[1];
  local_104.super_PositionColorVertex.position.m_data[0] = -0.3;
  local_104.super_PositionColorVertex.position.m_data[1] = 0.3;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0xd;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  this_02 = local_e0;
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_60);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_60[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_60[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_58[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_58[1];
  local_104.super_PositionColorVertex.position.m_data[0] = -1.0;
  local_104.super_PositionColorVertex.position.m_data[1] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0xe;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_70);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_70[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_70[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_68[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_68[1];
  local_104.super_PositionColorVertex.position.m_data[0] = -0.3;
  local_104.super_PositionColorVertex.position.m_data[1] = -0.3;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0xf;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_80);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_80[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_80[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_78[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_78[1];
  local_104.super_PositionColorVertex.position.m_data[0] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[1] = -1.0;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0x10;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_90);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_90[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_90[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_88[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_88[1];
  local_104.super_PositionColorVertex.position.m_data[0] = -0.3;
  local_104.super_PositionColorVertex.position.m_data[1] = -0.3;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0x11;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_a0);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_a0[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_a0[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_98[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_98[1];
  local_104.super_PositionColorVertex.position.m_data[0] = 0.3;
  local_104.super_PositionColorVertex.position.m_data[1] = 0.3;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0x12;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_b0);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_b0[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_b0[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_a8[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_a8[1];
  local_104.super_PositionColorVertex.position.m_data[0] = 0.3;
  local_104.super_PositionColorVertex.position.m_data[1] = -0.3;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0x13;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_c0);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_c0[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_c0[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_b8[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_b8[1];
  local_104.super_PositionColorVertex.position.m_data[0] = 0.3;
  local_104.super_PositionColorVertex.position.m_data[1] = 0.3;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0x14;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  local_108 = 0xffff0000;
  tcu::RGBA::toVec(local_d0);
  local_104.super_PositionColorVertex.color.m_data[0] = (float)local_d0[0].m_value;
  local_104.super_PositionColorVertex.color.m_data[1] = (float)local_d0[1].m_value;
  local_104.super_PositionColorVertex.color.m_data[2] = afStack_c8[0];
  local_104.super_PositionColorVertex.color.m_data[3] = afStack_c8[1];
  local_104.super_PositionColorVertex.position.m_data[0] = -1.0;
  local_104.super_PositionColorVertex.position.m_data[1] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[2] = 1.0;
  local_104.super_PositionColorVertex.position.m_data[3] = 1.0;
  local_104.refVertexIndex = 0xffffffff;
  std::vector<vkt::Draw::VertexElementData,_std::allocator<vkt::Draw::VertexElementData>_>::
  emplace_back<vkt::Draw::VertexElementData>(this_01,&local_104);
  DrawTestsBaseClass::initialize(&this_02->super_DrawTestsBaseClass);
  return;
}

Assistant:

DrawIndexed::DrawIndexed (Context &context, TestSpec testSpec)
	: DrawTestsBaseClass(context, testSpec.shaders[glu::SHADERTYPE_VERTEX], testSpec.shaders[glu::SHADERTYPE_FRAGMENT], testSpec.topology)
{
	switch (m_topology)
	{
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			m_indexes.push_back(0);
			m_indexes.push_back(0);
			m_indexes.push_back(2);
			m_indexes.push_back(0);
			m_indexes.push_back(6);
			m_indexes.push_back(6);
			m_indexes.push_back(0);
			m_indexes.push_back(7);
			break;
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			m_indexes.push_back(0);
			m_indexes.push_back(0);
			m_indexes.push_back(2);
			m_indexes.push_back(0);
			m_indexes.push_back(6);
			m_indexes.push_back(5);
			m_indexes.push_back(0);
			m_indexes.push_back(7);
			break;

		case vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_LINE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP_WITH_ADJACENCY:
		case vk::VK_PRIMITIVE_TOPOLOGY_PATCH_LIST:
		case vk::VK_PRIMITIVE_TOPOLOGY_LAST:
			DE_FATAL("Topology not implemented");
			break;
		default:
			DE_FATAL("Unknown topology");
			break;
	}

	for (int unusedIdx = 0; unusedIdx < VERTEX_OFFSET; unusedIdx++)
	{
		m_data.push_back(VertexElementData(tcu::Vec4(-1.0f, 1.0f, 1.0f, 1.0f), tcu::RGBA::blue().toVec(), -1));
	}

	int vertexIndex = VERTEX_OFFSET;

	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-1.0f,	 1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 1.0f,	-1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	-0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	-0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));
	m_data.push_back(VertexElementData(tcu::Vec4(	 0.3f,	 0.3f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), vertexIndex++));

	m_data.push_back(VertexElementData(tcu::Vec4(	-1.0f,	 1.0f,	1.0f,	1.0f), tcu::RGBA::blue().toVec(), -1));

	initialize();
}